

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O0

double __thiscall DBaseDecal::GetRealZ(DBaseDecal *this,side_t *wall)

{
  double dVar1;
  line_t_conflict *plVar2;
  uint uVar3;
  double dVar4;
  sector_t_conflict *local_38;
  sector_t_conflict *back;
  sector_t_conflict *front;
  line_t_conflict *line;
  side_t *wall_local;
  DBaseDecal *this_local;
  
  plVar2 = wall->linedef;
  if (plVar2->sidedef[0] == wall) {
    back = plVar2->frontsector;
    local_38 = plVar2->backsector;
  }
  else {
    back = plVar2->backsector;
    local_38 = plVar2->frontsector;
  }
  if (local_38 == (sector_t_conflict *)0x0) {
    local_38 = back;
  }
  uVar3 = this->RenderFlags & 0x300;
  if (uVar3 == 0x100) {
    if ((plVar2->flags & 8) == 0) {
      dVar1 = this->Z;
      dVar4 = sector_t::GetPlaneTexZ((sector_t *)local_38,1);
      this_local = (DBaseDecal *)(dVar1 + dVar4);
    }
    else {
      dVar1 = this->Z;
      dVar4 = sector_t::GetPlaneTexZ((sector_t *)back,1);
      this_local = (DBaseDecal *)(dVar1 + dVar4);
    }
  }
  else if (uVar3 == 0x200) {
    if ((plVar2->flags & 0x10) == 0) {
      dVar1 = this->Z;
      dVar4 = sector_t::GetPlaneTexZ((sector_t *)local_38,0);
      this_local = (DBaseDecal *)(dVar1 + dVar4);
    }
    else {
      dVar1 = this->Z;
      dVar4 = sector_t::GetPlaneTexZ((sector_t *)back,1);
      this_local = (DBaseDecal *)(dVar1 + dVar4);
    }
  }
  else if (uVar3 == 0x300) {
    if ((plVar2->flags & 0x10) == 0) {
      dVar1 = this->Z;
      dVar4 = sector_t::GetPlaneTexZ((sector_t *)back,1);
      this_local = (DBaseDecal *)(dVar1 + dVar4);
    }
    else {
      dVar1 = this->Z;
      dVar4 = sector_t::GetPlaneTexZ((sector_t *)back,0);
      this_local = (DBaseDecal *)(dVar1 + dVar4);
    }
  }
  else {
    this_local = (DBaseDecal *)this->Z;
  }
  return (double)this_local;
}

Assistant:

double DBaseDecal::GetRealZ (const side_t *wall) const
{
	const line_t *line = wall->linedef;
	const sector_t *front, *back;

	if (line->sidedef[0] == wall)
	{
		front = line->frontsector;
		back = line->backsector;
	}
	else
	{
		front = line->backsector;
		back = line->frontsector;
	}
	if (back == NULL)
	{
		back = front;
	}

	switch (RenderFlags & RF_RELMASK)
	{
	default:
		return Z;
	case RF_RELUPPER:
		if (line->flags & ML_DONTPEGTOP)
		{
			return Z + front->GetPlaneTexZ(sector_t::ceiling);
		}
		else
		{
			return Z + back->GetPlaneTexZ(sector_t::ceiling);
		}
	case RF_RELLOWER:
		if (line->flags & ML_DONTPEGBOTTOM)
		{
			return Z + front->GetPlaneTexZ(sector_t::ceiling);
		}
		else
		{
			return Z + back->GetPlaneTexZ(sector_t::floor);
		}
	case RF_RELMID:
		if (line->flags & ML_DONTPEGBOTTOM)
		{
			return Z + front->GetPlaneTexZ(sector_t::floor);
		}
		else
		{
			return Z + front->GetPlaneTexZ(sector_t::ceiling);
		}
	}
}